

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

ExecutionQueue *
llbuild::basic::createLaneBasedExecutionQueue
          (ExecutionQueueDelegate *delegate,int numLanes,SchedulerAlgorithm alg,QualityOfService qos
          ,char **environment)

{
  LaneBasedExecutionQueue *this;
  undefined8 local_28;
  char **environment_local;
  QualityOfService qos_local;
  SchedulerAlgorithm alg_local;
  int numLanes_local;
  ExecutionQueueDelegate *delegate_local;
  
  local_28 = environment;
  if (environment == (char **)0x0) {
    local_28 = _environ;
  }
  this = (LaneBasedExecutionQueue *)operator_new(0x230);
  anon_unknown.dwarf_3bc320::LaneBasedExecutionQueue::LaneBasedExecutionQueue
            (this,delegate,numLanes,alg,qos,local_28);
  return &this->super_ExecutionQueue;
}

Assistant:

ExecutionQueue* llbuild::basic::createLaneBasedExecutionQueue(
    ExecutionQueueDelegate& delegate, int numLanes, SchedulerAlgorithm alg,
    QualityOfService qos, const char* const* environment
) {
  if (!environment) {
    environment = const_cast<const char* const*>(environ);
  }
  return new LaneBasedExecutionQueue(delegate, numLanes, alg, qos, environment);
}